

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACEncode.cpp
# Opt level: O0

int __thiscall Inflate::readCB(Inflate *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  int temp;
  uint local_c;
  
  sVar1 = BitInStream::read(*(BitInStream **)(in_RDI + 0x58),in_ESI,in_RDX,in_RCX);
  local_c = (uint)sVar1;
  if (local_c == 0xffffffff) {
    local_c = (uint)(*(int *)(in_RDI + 0x50) == 0x10);
    *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) + -1;
    if (*(int *)(in_RDI + 0x50) == -1) {
      *(undefined1 *)(in_RDI + 0x60) = 1;
    }
  }
  return local_c;
}

Assistant:

int Inflate::readCB() {
    int temp = bitin.read();
    if (temp == -1) {
        (nBits == 16 ? temp = 1 : temp = 0);
        nBits--;
        if (nBits == -1) {
            readingDone = true;
        }
    }
    return temp;
}